

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

EStatusCode
PDFWriter::RecryptPDF
          (string *inOriginalPDFPath,string *inOriginalPDFPassword,string *inNewPDFPath,
          LogConfiguration *inLogConfiguration,PDFCreationSettings *inPDFCreationSettings,
          EPDFVersion inOveridePDFVersion)

{
  IByteReaderWithPosition *inOriginalPDFStream;
  IByteWriterWithPosition *inNewPDFStream;
  EStatusCode status;
  undefined1 local_a0 [8];
  OutputFile newPDF;
  InputFile originalPDF;
  EPDFVersion inOveridePDFVersion_local;
  PDFCreationSettings *inPDFCreationSettings_local;
  LogConfiguration *inLogConfiguration_local;
  string *inNewPDFPath_local;
  string *inOriginalPDFPassword_local;
  string *inOriginalPDFPath_local;
  
  InputFile::InputFile((InputFile *)&newPDF.mFileStream);
  OutputFile::OutputFile((OutputFile *)local_a0);
  inOriginalPDFPath_local._4_4_ =
       InputFile::OpenFile((InputFile *)&newPDF.mFileStream,inOriginalPDFPath);
  if ((inOriginalPDFPath_local._4_4_ == eSuccess) &&
     (inOriginalPDFPath_local._4_4_ =
           OutputFile::OpenFile((OutputFile *)local_a0,inNewPDFPath,false),
     inOriginalPDFPath_local._4_4_ == eSuccess)) {
    inOriginalPDFStream = InputFile::GetInputStream((InputFile *)&newPDF.mFileStream);
    inNewPDFStream = OutputFile::GetOutputStream((OutputFile *)local_a0);
    inOriginalPDFPath_local._4_4_ =
         RecryptPDF(inOriginalPDFStream,inOriginalPDFPassword,inNewPDFStream,inLogConfiguration,
                    inPDFCreationSettings,inOveridePDFVersion);
  }
  OutputFile::~OutputFile((OutputFile *)local_a0);
  InputFile::~InputFile((InputFile *)&newPDF.mFileStream);
  return inOriginalPDFPath_local._4_4_;
}

Assistant:

PDFHummus::EStatusCode PDFWriter::RecryptPDF(
	const std::string& inOriginalPDFPath,
	const std::string& inOriginalPDFPassword,
	const std::string& inNewPDFPath,
	const LogConfiguration& inLogConfiguration,
	const PDFCreationSettings& inPDFCreationSettings,
	EPDFVersion inOveridePDFVersion) {

	InputFile originalPDF;
	OutputFile newPDF;

	EStatusCode status = originalPDF.OpenFile(inOriginalPDFPath);
	if (status != eSuccess)
		return status;

	status = newPDF.OpenFile(inNewPDFPath);
	if (status != eSuccess)
		return status;

	return PDFWriter::RecryptPDF(
		originalPDF.GetInputStream(),
		inOriginalPDFPassword,
		newPDF.GetOutputStream(),
		inLogConfiguration,
		inPDFCreationSettings,
		inOveridePDFVersion
		);
}